

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Node.hpp
# Opt level: O2

void __thiscall
CAMFImporter_NodeElement_Metadata::CAMFImporter_NodeElement_Metadata
          (CAMFImporter_NodeElement_Metadata *this,CAMFImporter_NodeElement *pParent)

{
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar1;
  
  (this->super_CAMFImporter_NodeElement).Type = ENET_Metadata;
  (this->super_CAMFImporter_NodeElement).ID._M_dataplus._M_p =
       (pointer)&(this->super_CAMFImporter_NodeElement).ID.field_2;
  (this->super_CAMFImporter_NodeElement).ID._M_string_length = 0;
  (this->super_CAMFImporter_NodeElement).ID.field_2._M_local_buf[0] = '\0';
  (this->super_CAMFImporter_NodeElement).Parent = pParent;
  plVar1 = &(this->super_CAMFImporter_NodeElement).Child;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_CAMFImporter_NodeElement).Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_Metadata_0072ada0;
  (this->Type)._M_dataplus._M_p = (pointer)&(this->Type).field_2;
  (this->Type)._M_string_length = 0;
  (this->Type).field_2._M_local_buf[0] = '\0';
  (this->Value)._M_dataplus._M_p = (pointer)&(this->Value).field_2;
  (this->Value)._M_string_length = 0;
  (this->Value).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

CAMFImporter_NodeElement(const EType pType, CAMFImporter_NodeElement* pParent)
	: Type(pType)
    , ID()
    , Parent(pParent)
    , Child() {
        // empty
    }